

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O0

void * nettlp_cb_thread(void *arg)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  pthread_t *in_RDI;
  size_t __cpu;
  nettlp *nt;
  cpu_set_t target_cpu_set;
  int cpu;
  psmem_thread *pt;
  void *in_stack_00001020;
  nettlp_cb *in_stack_00001028;
  int in_stack_00001034;
  nettlp **in_stack_00001038;
  cpu_set_t local_98;
  uint local_14;
  pthread_t *local_10;
  
  bVar1 = *(byte *)((long)in_RDI + 0x12);
  local_10 = in_RDI;
  iVar2 = count_online_cpus();
  local_14 = (int)(uint)bVar1 % iVar2;
  memset(&local_98,0,0x80);
  if ((ulong)(long)(int)local_14 >> 3 < 0x80) {
    uVar3 = (ulong)(long)(int)local_14 >> 6;
    local_98.__bits[uVar3] = 1L << ((byte)local_14 & 0x3f) | local_98.__bits[uVar3];
  }
  pthread_setaffinity_np(*local_10,0x80,&local_98);
  if (nostdout == 0) {
    fprintf(_stdout,"%s: start callback on cpu %d, port %u\n","nettlp_cb_thread",(ulong)local_14,
            (ulong)*(ushort *)((long)local_10 + 0x1c));
  }
  nettlp_run_cb(in_stack_00001038,in_stack_00001034,in_stack_00001028,in_stack_00001020);
  return (void *)0x0;
}

Assistant:

void *nettlp_cb_thread(void *arg)
{
	struct psmem_thread *pt = arg;
	int cpu = pt->nt.tag % count_online_cpus();
	cpu_set_t target_cpu_set;
	struct nettlp *nt = &pt->nt;
	
	CPU_ZERO(&target_cpu_set);
	CPU_SET(cpu, &target_cpu_set);
	pthread_setaffinity_np(pt->tid, sizeof(cpu_set_t), &target_cpu_set);

	pr_info("start callback on cpu %d, port %u\n", cpu, pt->nt.port);
	nettlp_run_cb(&(nt), 1, pt->cb, pt->psmem);

	return NULL;
}